

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O2

void ZSTD_ldm_gear_init(ldmRollingHashState_t *state,ldmParams_t *params)

{
  U32 UVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  
  UVar1 = params->hashRateLog;
  uVar4 = 0x40;
  if (params->minMatchLength < 0x40) {
    uVar4 = params->minMatchLength;
  }
  state->rolling = 0xffffffff;
  bVar2 = (byte)UVar1;
  bVar3 = 0;
  if (UVar1 - 1 < uVar4) {
    bVar3 = (char)uVar4 - bVar2;
  }
  state->stopMask = ~(-1L << (bVar2 & 0x3f)) << (bVar3 & 0x3f);
  return;
}

Assistant:

static void ZSTD_ldm_gear_init(ldmRollingHashState_t* state, ldmParams_t const* params)
{
    unsigned maxBitsInMask = MIN(params->minMatchLength, 64);
    unsigned hashRateLog = params->hashRateLog;

    state->rolling = ~(U32)0;

    /* The choice of the splitting criterion is subject to two conditions:
     *   1. it has to trigger on average every 2^(hashRateLog) bytes;
     *   2. ideally, it has to depend on a window of minMatchLength bytes.
     *
     * In the gear hash algorithm, bit n depends on the last n bytes;
     * so in order to obtain a good quality splitting criterion it is
     * preferable to use bits with high weight.
     *
     * To match condition 1 we use a mask with hashRateLog bits set
     * and, because of the previous remark, we make sure these bits
     * have the highest possible weight while still respecting
     * condition 2.
     */
    if (hashRateLog > 0 && hashRateLog <= maxBitsInMask) {
        state->stopMask = (((U64)1 << hashRateLog) - 1) << (maxBitsInMask - hashRateLog);
    } else {
        /* In this degenerate case we simply honor the hash rate. */
        state->stopMask = ((U64)1 << hashRateLog) - 1;
    }
}